

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseSyntaxIdentifier(Parser *this,LocationRecorder *parent)

{
  Tokenizer *pTVar1;
  pointer pcVar2;
  ErrorCollector *pEVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  int iVar7;
  long *plVar8;
  long *plVar9;
  string syntax;
  LocationRecorder syntax_location;
  Token syntax_token;
  string local_e0;
  long *local_c0;
  long local_b8;
  long local_b0;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  LocationRecorder local_a0;
  TokenType local_88;
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  ulong local_60;
  ColumnNumber local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  LocationRecorder::LocationRecorder(&local_a0,parent,0xc);
  bVar6 = Consume(this,"syntax",
                  "File must begin with a syntax statement, e.g. \'syntax = \"proto2\";\'.");
  if (bVar6) {
    bVar6 = Consume(this,"=");
    if (bVar6) {
      pTVar1 = this->input_;
      local_88 = (pTVar1->current_).type;
      pcVar2 = (pTVar1->current_).text._M_dataplus._M_p;
      local_80[0] = local_70;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_80,pcVar2,pcVar2 + (pTVar1->current_).text._M_string_length);
      local_58 = (pTVar1->current_).end_column;
      local_60._0_4_ = (pTVar1->current_).line;
      local_60._4_4_ = (pTVar1->current_).column;
      local_e0._M_string_length = 0;
      local_e0.field_2._M_local_buf[0] = '\0';
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      bVar6 = ConsumeString(this,&local_e0,"Expected syntax identifier.");
      if (bVar6) {
        bVar6 = ConsumeEndOfDeclaration(this,";",&local_a0);
        if (!bVar6) goto LAB_00340efa;
        std::__cxx11::string::_M_assign((string *)&this->syntax_identifier_);
        iVar7 = std::__cxx11::string::compare((char *)&local_e0);
        bVar6 = true;
        if (iVar7 != 0) {
          iVar7 = std::__cxx11::string::compare((char *)&local_e0);
          uVar5 = local_60;
          if ((iVar7 != 0) && (this->stop_after_syntax_identifier_ == false)) {
            uVar4 = local_60 >> 0x20;
            std::operator+(&local_50,"Unrecognized syntax identifier \"",&local_e0);
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
            plVar9 = plVar8 + 2;
            if ((long *)*plVar8 == plVar9) {
              local_b0 = *plVar9;
              uStack_a8 = (undefined4)plVar8[3];
              uStack_a4 = *(undefined4 *)((long)plVar8 + 0x1c);
              local_c0 = &local_b0;
            }
            else {
              local_b0 = *plVar9;
              local_c0 = (long *)*plVar8;
            }
            local_b8 = plVar8[1];
            *plVar8 = (long)plVar9;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            pEVar3 = this->error_collector_;
            if (pEVar3 != (ErrorCollector *)0x0) {
              (*pEVar3->_vptr_ErrorCollector[2])(pEVar3,uVar5 & 0xffffffff,uVar4,&local_c0);
            }
            this->had_errors_ = true;
            if (local_c0 != &local_b0) {
              operator_delete(local_c0);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p);
            }
            goto LAB_00340efa;
          }
        }
      }
      else {
LAB_00340efa:
        bVar6 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p);
      }
      if (local_80[0] != local_70) {
        operator_delete(local_80[0]);
      }
      goto LAB_00340e7a;
    }
  }
  bVar6 = false;
LAB_00340e7a:
  LocationRecorder::~LocationRecorder(&local_a0);
  return bVar6;
}

Assistant:

bool Parser::ParseSyntaxIdentifier(const LocationRecorder& parent) {
  LocationRecorder syntax_location(parent,
                                   FileDescriptorProto::kSyntaxFieldNumber);
  DO(Consume(
      "syntax",
      "File must begin with a syntax statement, e.g. 'syntax = \"proto2\";'."));
  DO(Consume("="));
  io::Tokenizer::Token syntax_token = input_->current();
  std::string syntax;
  DO(ConsumeString(&syntax, "Expected syntax identifier."));
  DO(ConsumeEndOfDeclaration(";", &syntax_location));

  syntax_identifier_ = syntax;

  if (syntax != "proto2" && syntax != "proto3" &&
      !stop_after_syntax_identifier_) {
    AddError(syntax_token.line, syntax_token.column,
             "Unrecognized syntax identifier \"" + syntax +
                 "\".  This parser "
                 "only recognizes \"proto2\" and \"proto3\".");
    return false;
  }

  return true;
}